

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O2

table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>_>_>
* __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>_>_>
::operator=(table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>_>_>
            *this,table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>_>_>
                  *x)

{
  if (this != x) {
    clear(this);
    noshrink_reserve(this,(x->size_ctrl).size);
    copy_elements_from(this,x);
  }
  return this;
}

Assistant:

table_core& operator=(const table_core& x) {
        BOOST_UNORDERED_STATIC_ASSERT_HASH_PRED(Hash, Pred)

        static constexpr auto pocca = alloc_traits::propagate_on_container_copy_assignment::value;

        if (this != std::addressof(x)) {
            /* If copy construction here winds up throwing, the container is still
             * left intact so we perform these operations first.
             */
            hasher tmp_h = x.h();
            key_equal tmp_p = x.pred();

            clear();

            /* Because we've asserted at compile-time that Hash and Pred are nothrow
             * swappable, we can safely mutate our source container and maintain
             * consistency between the Hash, Pred compatibility.
             */
            using std::swap;
            swap(h(), tmp_h);
            swap(pred(), tmp_p);

            if_constexpr<pocca>([&, this] {
                if (al() != x.al()) {
                    auto ah = x.make_arrays(std::size_t(std::ceil(float(x.size()) / mlf)));
                    delete_arrays(arrays);
                    arrays = ah.release();
                    size_ctrl.ml = initial_max_load();
                }
                copy_assign_if<pocca>(al(), x.al());
            });
            /* noshrink: favor memory reuse over tightness */
            noshrink_reserve(x.size());
            copy_elements_from(x);
        }
        return *this;
    }